

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O3

void fake_a_rnd(int min,int max,int column)

{
  long in_RAX;
  long len;
  long local_18;
  
  local_18 = in_RAX;
  dss_random(&local_18,(long)min,(long)max,(long)column);
  NthElement((ulong)(local_18 != (local_18 / 5) * 5) + local_18 / 5,&Seed[column].usage);
  return;
}

Assistant:

void
fake_a_rnd(int min, int max, int column)
{
   long len, itcount;
   RANDOM(len, (long)min, (long)max, (long)column);
   if (len % 5L == 0)
      itcount = len/5;
   else itcount = len/5 + 1L;
   NthElement(itcount, &Seed[column].usage);
   return;
}